

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

bool __thiscall
deqp::gls::MultiVertexArrayTest::isUnalignedBufferOffsetTest(MultiVertexArrayTest *this)

{
  InputType IVar1;
  pointer pAVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  pAVar2 = (this->m_spec).arrays.
           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->m_spec).arrays.
                super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2;
  if (lVar3 == 0) {
    bVar7 = false;
  }
  else {
    uVar4 = lVar3 >> 6;
    bVar7 = true;
    uVar5 = 1;
    do {
      if (pAVar2->storage == STORAGE_BUFFER) {
        IVar1 = pAVar2->inputType;
        if ((IVar1 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) || (IVar1 == INPUTTYPE_INT_2_10_10_10)) {
          iVar6 = 4;
        }
        else {
          iVar6 = Array::inputTypeSize::size[(int)IVar1];
        }
        if (pAVar2->offset % iVar6 != 0) {
          return bVar7;
        }
      }
      bVar7 = uVar5 < uVar4;
      lVar3 = (-(ulong)(uVar4 == 0) - uVar4) + uVar5;
      uVar5 = uVar5 + 1;
      pAVar2 = pAVar2 + 1;
    } while (lVar3 != 0);
  }
  return bVar7;
}

Assistant:

bool MultiVertexArrayTest::isUnalignedBufferOffsetTest (void) const
{
	// Buffer offsets should be data type size aligned
	for (size_t i = 0; i < m_spec.arrays.size(); ++i)
	{
		if (m_spec.arrays[i].storage == Array::STORAGE_BUFFER)
		{
			const bool inputTypePacked = m_spec.arrays[i].inputType == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_spec.arrays[i].inputType == Array::INPUTTYPE_INT_2_10_10_10;

			int dataTypeSize = Array::inputTypeSize(m_spec.arrays[i].inputType);
			if (inputTypePacked)
				dataTypeSize = 4;

			if (m_spec.arrays[i].offset % dataTypeSize != 0)
				return true;
		}
	}

	return false;
}